

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void freeArray(Array a)

{
  element *peVar1;
  element *__ptr;
  
  __ptr = a->head;
  while (__ptr != (element *)0x0) {
    peVar1 = __ptr->next;
    deepFreeData(__ptr->data);
    free(__ptr);
    __ptr = peVar1;
  }
  free(a);
  return;
}

Assistant:

void freeArray(Array a) {
    struct element *el = a->head, *last;
    while (el) {
        last = el;
        el = el->next;
        deepFreeData(last->data);
        free(last);
    }
    free(a);
}